

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_movement_t *
golf_movement_ramp(golf_movement_t *__return_storage_ptr__,float t0,float length,float theta0,
                  float theta1,float transition_length,vec3 axis)

{
  float transition_length_local;
  float theta1_local;
  float theta0_local;
  float length_local;
  float t0_local;
  vec3 axis_local;
  
  __return_storage_ptr__->type = GOLF_MOVEMENT_RAMP;
  __return_storage_ptr__->repeats = true;
  __return_storage_ptr__->t0 = t0;
  __return_storage_ptr__->length = length;
  (__return_storage_ptr__->field_4).linear.p0.x = theta0;
  (__return_storage_ptr__->field_4).linear.p0.y = theta1;
  (__return_storage_ptr__->field_4).linear.p0.z = transition_length;
  *(long *)((long)&__return_storage_ptr__->field_4 + 0xc) = axis._0_8_;
  (__return_storage_ptr__->field_4).linear.p1.z = axis.z;
  return __return_storage_ptr__;
}

Assistant:

golf_movement_t golf_movement_ramp(float t0, float length, float theta0, float theta1, float transition_length, vec3 axis) {
    golf_movement_t movement;
    movement.type = GOLF_MOVEMENT_RAMP;
    movement.repeats = true;
    movement.t0 = t0;
    movement.length = length;
    movement.ramp.theta0 = theta0;
    movement.ramp.theta1 = theta1;
    movement.ramp.transition_length = transition_length;
    movement.ramp.axis = axis;
    return movement;
}